

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_logger.c
# Opt level: O1

void pcp_strerror(int errnum,char *buf,size_t buflen)

{
  memset(buf,0,buflen);
  __xpg_strerror_r(errnum,buf,buflen);
  return;
}

Assistant:

void pcp_strerror(int errnum, char *buf, size_t buflen) {

    memset(buf, 0, buflen);

#ifdef WIN32

    strerror_s(buf, buflen, errnum);

#else  // WIN32
    strerror_r(errnum, buf, buflen);
#endif // WIN32
}